

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fNegativeStateApiTests.cpp
# Opt level: O1

void deqp::gles31::Functional::NegativeTestShared::get_internalformativ(NegativeTestContext *ctx)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  bool bVar2;
  GLint params [16];
  string local_78;
  GLint local_58 [18];
  
  local_58[0xc] = 0xcdcdcdcd;
  local_58[0xd] = 0xcdcdcdcd;
  local_58[0xe] = 0xcdcdcdcd;
  local_58[0xf] = 0xcdcdcdcd;
  local_58[8] = 0xcdcdcdcd;
  local_58[9] = 0xcdcdcdcd;
  local_58[10] = 0xcdcdcdcd;
  local_58[0xb] = 0xcdcdcdcd;
  local_58[4] = 0xcdcdcdcd;
  local_58[5] = 0xcdcdcdcd;
  local_58[6] = 0xcdcdcdcd;
  local_58[7] = 0xcdcdcdcd;
  local_58[0] = -0x32323233;
  local_58[1] = 0xcdcdcdcd;
  local_58[2] = 0xcdcdcdcd;
  local_58[3] = 0xcdcdcdcd;
  paVar1 = &local_78.field_2;
  local_78._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_78,"GL_INVALID_VALUE is generated if bufSize is negative.","");
  NegativeTestContext::beginSection(ctx,&local_78);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78._M_dataplus._M_p != paVar1) {
    operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
  }
  glu::CallLogWrapper::glGetInternalformativ
            (&ctx->super_CallLogWrapper,0x8d41,0x8058,0x9380,-1,local_58);
  NegativeTestContext::expectError(ctx,0x501);
  NegativeTestContext::endSection(ctx);
  local_78._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_78,
             "GL_INVALID_ENUM is generated if pname is not GL_SAMPLES or GL_NUM_SAMPLE_COUNTS.","");
  NegativeTestContext::beginSection(ctx,&local_78);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78._M_dataplus._M_p != paVar1) {
    operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
  }
  glu::CallLogWrapper::glGetInternalformativ
            (&ctx->super_CallLogWrapper,0x8d41,0x8058,0xffffffff,0x10,local_58);
  NegativeTestContext::expectError(ctx,0x500);
  NegativeTestContext::endSection(ctx);
  local_78._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_78,
             "GL_INVALID_ENUM is generated if internalformat is not color-, depth-, or stencil-renderable."
             ,"");
  NegativeTestContext::beginSection(ctx,&local_78);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78._M_dataplus._M_p != paVar1) {
    operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
  }
  bVar2 = glu::ContextInfo::isExtensionSupported(ctx->m_ctxInfo,"GL_EXT_render_snorm");
  if (!bVar2) {
    glu::CallLogWrapper::glGetInternalformativ
              (&ctx->super_CallLogWrapper,0x8d41,0x8f95,0x9380,0x10,local_58);
    NegativeTestContext::expectError(ctx,0x500);
  }
  glu::CallLogWrapper::glGetInternalformativ
            (&ctx->super_CallLogWrapper,0x8d41,0x9274,0x9380,0x10,local_58);
  NegativeTestContext::expectError(ctx,0x500);
  NegativeTestContext::endSection(ctx);
  local_78._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_78,"GL_INVALID_ENUM is generated if target is not GL_RENDERBUFFER.",""
            );
  NegativeTestContext::beginSection(ctx,&local_78);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78._M_dataplus._M_p != paVar1) {
    operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
  }
  glu::CallLogWrapper::glGetInternalformativ
            (&ctx->super_CallLogWrapper,0xffffffff,0x8058,0x9380,0x10,local_58);
  NegativeTestContext::expectError(ctx,0x500);
  glu::CallLogWrapper::glGetInternalformativ
            (&ctx->super_CallLogWrapper,0x8d40,0x8058,0x9380,0x10,local_58);
  NegativeTestContext::expectError(ctx,0x500);
  bVar2 = glu::ContextInfo::isExtensionSupported(ctx->m_ctxInfo,"GL_EXT_sparse_texture");
  if (!bVar2) {
    glu::CallLogWrapper::glGetInternalformativ
              (&ctx->super_CallLogWrapper,0xde1,0x8058,0x9380,0x10,local_58);
    NegativeTestContext::expectError(ctx,0x500);
  }
  NegativeTestContext::endSection(ctx);
  return;
}

Assistant:

void get_internalformativ (NegativeTestContext& ctx)
{
	GLint params[16];

	deMemset(&params[0], 0xcd, sizeof(params));

	ctx.beginSection("GL_INVALID_VALUE is generated if bufSize is negative.");
	ctx.glGetInternalformativ	(GL_RENDERBUFFER, GL_RGBA8, GL_NUM_SAMPLE_COUNTS, -1, &params[0]);
	ctx.expectError				(GL_INVALID_VALUE);
	ctx.endSection();

	ctx.beginSection("GL_INVALID_ENUM is generated if pname is not GL_SAMPLES or GL_NUM_SAMPLE_COUNTS.");
	ctx.glGetInternalformativ	(GL_RENDERBUFFER, GL_RGBA8, -1, 16, &params[0]);
	ctx.expectError				(GL_INVALID_ENUM);
	ctx.endSection();

	ctx.beginSection("GL_INVALID_ENUM is generated if internalformat is not color-, depth-, or stencil-renderable.");

	if (!ctx.getContextInfo().isExtensionSupported("GL_EXT_render_snorm"))
	{
		ctx.glGetInternalformativ	(GL_RENDERBUFFER, GL_RG8_SNORM, GL_NUM_SAMPLE_COUNTS, 16, &params[0]);
		ctx.expectError				(GL_INVALID_ENUM);
	}

	ctx.glGetInternalformativ	(GL_RENDERBUFFER, GL_COMPRESSED_RGB8_ETC2, GL_NUM_SAMPLE_COUNTS, 16, &params[0]);
	ctx.expectError				(GL_INVALID_ENUM);
	ctx.endSection();

	ctx.beginSection("GL_INVALID_ENUM is generated if target is not GL_RENDERBUFFER.");
	ctx.glGetInternalformativ	(-1, GL_RGBA8, GL_NUM_SAMPLE_COUNTS, 16, &params[0]);
	ctx.expectError				(GL_INVALID_ENUM);
	ctx.glGetInternalformativ	(GL_FRAMEBUFFER, GL_RGBA8, GL_NUM_SAMPLE_COUNTS, 16, &params[0]);
	ctx.expectError				(GL_INVALID_ENUM);

	if (!ctx.getContextInfo().isExtensionSupported("GL_EXT_sparse_texture"))
	{
		ctx.glGetInternalformativ	(GL_TEXTURE_2D, GL_RGBA8, GL_NUM_SAMPLE_COUNTS, 16, &params[0]);
		ctx.expectError				(GL_INVALID_ENUM);
	}

	ctx.endSection();
}